

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ir.c
# Opt level: O2

TRef lj_ir_kptr_(jit_State *J,IROp op,void *ptr)

{
  IRIns *pIVar1;
  IRRef1 *pIVar2;
  uint uVar3;
  ulong uVar4;
  IRRef1 *pIVar5;
  
  pIVar1 = (J->cur).ir;
  pIVar5 = J->chain + op;
  pIVar2 = pIVar5;
  do {
    uVar4 = (ulong)*pIVar2;
    uVar3 = (uint)*pIVar2;
    if (uVar4 == 0) {
      uVar3 = (J->cur).nk - 2;
      uVar4 = (ulong)uVar3;
      if (uVar3 < J->irbotlim) {
        lj_ir_growbot(J);
        pIVar1 = (J->cur).ir;
      }
      (J->cur).nk = uVar3;
      pIVar1[uVar4].field_1.op12 = 0;
      pIVar1[uVar4 + 1] = (IRIns)ptr;
      *(undefined1 *)((long)pIVar1 + uVar4 * 8 + 4) = 9;
      *(char *)((long)pIVar1 + uVar4 * 8 + 5) = (char)op;
      *(IRRef1 *)((long)pIVar1 + uVar4 * 8 + 6) = *pIVar5;
      *pIVar5 = (ushort)uVar3;
      break;
    }
    pIVar2 = &(&pIVar1->field_0)[uVar4].prev;
  } while (pIVar1[uVar4 + 1] != (IRIns)ptr);
  return uVar3 + 0x9000000;
}

Assistant:

TRef lj_ir_kptr_(jit_State *J, IROp op, void *ptr)
{
  IRIns *ir, *cir = J->cur.ir;
  IRRef ref;
#if LJ_64 && !LJ_GC64
  lj_assertJ((void *)(uintptr_t)u32ptr(ptr) == ptr, "out-of-range GC pointer");
#endif
  for (ref = J->chain[op]; ref; ref = cir[ref].prev)
    if (ir_kptr(&cir[ref]) == ptr)
      goto found;
#if LJ_GC64
  ref = ir_nextk64(J);
#else
  ref = ir_nextk(J);
#endif
  ir = IR(ref);
  ir->op12 = 0;
  setmref(ir[LJ_GC64].ptr, ptr);
  ir->t.irt = IRT_PGC;
  ir->o = op;
  ir->prev = J->chain[op];
  J->chain[op] = (IRRef1)ref;
found:
  return TREF(ref, IRT_PGC);
}